

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O1

void cortex_a8_initfn(uc_struct_conflict1 *uc,CPUState *obj)

{
  obj[1].tb_jmp_cache[0x5f3] = (TranslationBlock *)((ulong)obj[1].tb_jmp_cache[0x5f3] | 0x200100920)
  ;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x646) = 0x410fc080;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x647) = 0x410330c0;
  obj[1].tb_jmp_cache[0x63a] = (TranslationBlock *)0x1111111110222;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x323c) = 0xc5007882048004;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x3244) = 0x1100001031;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x31dc) = 0x1514100000000400;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x64c) = 0;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x31bc) = 0x2000000031100003;
  *(undefined8 *)((long)obj[1].tb_jmp_cache + 0x31c4) = 0x1101202000;
  obj[1].tb_jmp_cache[0x634] = (TranslationBlock *)0x1211211100101111;
  obj[1].tb_jmp_cache[0x635] = (TranslationBlock *)0x1111213121232031;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x636) = 0x111142;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x64f) = 0xa000003;
  obj[1].tb_jmp_cache[0x651] = (TranslationBlock *)0xe007e01a;
  obj[1].tb_jmp_cache[0x652] = (TranslationBlock *)0x2007e01a;
  obj[1].tb_jmp_cache[0x653] = (TranslationBlock *)0xf0000000;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x662) = 2;
  define_arm_cp_regs_with_opaque_arm((ARMCPU *)obj,cortexa8_cp_reginfo,(void *)0x0);
  return;
}

Assistant:

static void cortex_a8_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);

    set_feature(&cpu->env, ARM_FEATURE_V7);
    set_feature(&cpu->env, ARM_FEATURE_NEON);
    set_feature(&cpu->env, ARM_FEATURE_THUMB2EE);
    set_feature(&cpu->env, ARM_FEATURE_DUMMY_C15_REGS);
    set_feature(&cpu->env, ARM_FEATURE_EL3);
    cpu->midr = 0x410fc080;
    cpu->reset_fpsid = 0x410330c0;
    cpu->isar.mvfr0 = 0x11110222;
    cpu->isar.mvfr1 = 0x00011111;
    cpu->ctr = 0x82048004;
    cpu->reset_sctlr = 0x00c50078;
    cpu->id_pfr0 = 0x1031;
    cpu->id_pfr1 = 0x11;
    cpu->isar.id_dfr0 = 0x400;
    cpu->id_afr0 = 0;
    cpu->isar.id_mmfr0 = 0x31100003;
    cpu->isar.id_mmfr1 = 0x20000000;
    cpu->isar.id_mmfr2 = 0x01202000;
    cpu->isar.id_mmfr3 = 0x11;
    cpu->isar.id_isar0 = 0x00101111;
    cpu->isar.id_isar1 = 0x12112111;
    cpu->isar.id_isar2 = 0x21232031;
    cpu->isar.id_isar3 = 0x11112131;
    cpu->isar.id_isar4 = 0x00111142;
    cpu->isar.dbgdidr = 0x15141000;
    cpu->clidr = (1 << 27) | (2 << 24) | 3;
    cpu->ccsidr[0] = 0xe007e01a; /* 16k L1 dcache. */
    cpu->ccsidr[1] = 0x2007e01a; /* 16k L1 icache. */
    cpu->ccsidr[2] = 0xf0000000; /* No L2 icache. */
    cpu->reset_auxcr = 2;
    define_arm_cp_regs(cpu, cortexa8_cp_reginfo);
}